

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ComparisonTestT<long>(void)

{
  ComparisonTestTU<long,char>();
  ComparisonTestTU<long,signed_char>();
  ComparisonTestTU<long,unsigned_char>();
  ComparisonTestTU<long,short>();
  ComparisonTestTU<long,unsigned_short>();
  ComparisonTestTU<long,int>();
  ComparisonTestTU<long,unsigned_int>();
  ComparisonTestTU<long,long>();
  ComparisonTestTU<long,unsigned_long>();
  ComparisonTestTU<long,long_long>();
  ComparisonTestTU<long,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}